

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein_distance.hpp
# Opt level: O0

int levenshtein_distance(string *s1,string *s2)

{
  undefined1 auVar1 [16];
  initializer_list<int> __l;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  int local_74;
  int result;
  int local_6c;
  iterator local_68;
  undefined8 local_60;
  int local_54;
  char local_4e;
  char local_4d;
  int diff_cost;
  char c2;
  int iStack_48;
  char c1;
  int old_diagonal;
  int y;
  int last_diagonal;
  int x;
  int capitalize_cost;
  int change_cost;
  int insert_cost;
  int *column;
  int local_20;
  int column_start;
  int s2len;
  int s1len;
  string *s2_local;
  string *s1_local;
  
  _s2len = s2;
  s2_local = s1;
  column_start = std::__cxx11::string::size();
  local_20 = std::__cxx11::string::size();
  column._4_4_ = 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(column_start + 1);
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  _change_cost = (int *)operator_new__(uVar4);
  std::iota<int*,int>(_change_cost + column._4_4_,_change_cost + (long)column_start + 1,column._4_4_
                     );
  capitalize_cost = 4;
  x = 2;
  last_diagonal = 1;
  for (y = column._4_4_; y <= local_20; y = y + 1) {
    *_change_cost = y;
    old_diagonal = y - column._4_4_;
    for (iStack_48 = column._4_4_; iStack_48 <= column_start; iStack_48 = iStack_48 + 1) {
      diff_cost = _change_cost[iStack_48];
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)s2_local);
      local_4d = *pcVar5;
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)_s2len);
      local_4e = *pcVar5;
      if (local_4d == local_4e) {
        local_54 = 0;
      }
      else {
        iVar3 = tolower((int)local_4d);
        iVar2 = tolower((int)local_4e);
        if (iVar3 == iVar2) {
          local_54 = 1;
        }
        else {
          local_54 = 2;
        }
      }
      local_74 = _change_cost[iStack_48] + 4;
      result = _change_cost[iStack_48 + -1] + 4;
      local_6c = old_diagonal + local_54;
      local_68 = &local_74;
      local_60 = 3;
      __l._M_len = 3;
      __l._M_array = local_68;
      iVar3 = std::min<int>(__l);
      _change_cost[iStack_48] = iVar3;
      old_diagonal = diff_cost;
    }
  }
  iVar3 = _change_cost[column_start];
  if (_change_cost != (int *)0x0) {
    operator_delete__(_change_cost);
  }
  return iVar3;
}

Assistant:

int levenshtein_distance(const std::string &s1, const std::string &s2) {
  // To change the type this function manipulates and returns, change
  // the return type and the types of the two variables below.
  int s1len = s1.size();
  int s2len = s2.size();

  int column_start = 1;

  int *column = new int[s1len + 1];
  std::iota(column + column_start, column + s1len + 1, column_start);

  constexpr int insert_cost = 4;
  constexpr int change_cost = 2;
  constexpr int capitalize_cost = 1;

  for (int x = column_start; x <= s2len; x++) {
    column[0] = x;
    int last_diagonal = x - column_start;
    for (int y = column_start; y <= s1len; y++) {
      int old_diagonal = column[y];

      char c1 = s1[y - 1];
      char c2 = s2[x - 1];
      int diff_cost;
      if (c1 == c2) {
        diff_cost = 0;
      } else if (std::tolower(c1) == std::tolower(c2)) {
        diff_cost = capitalize_cost;
      } else {
        diff_cost = change_cost;
      }

      // clang-format off
      column[y] = std::min({
        column[y] + insert_cost,
        column[y - 1] + insert_cost,
        last_diagonal + diff_cost
      });
      // clang-format on
      last_diagonal = old_diagonal;
    }
  }
  int result = column[s1len];
  delete[] column;
  return result;
}